

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O3

void __thiscall soul::ASTVisitor::visit(ASTVisitor *this,CommaSeparatedList *l)

{
  size_t sVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  long lVar3;
  
  sVar1 = (l->items).numActive;
  if (sVar1 != 0) {
    ppVar2 = (l->items).items;
    lVar3 = 0;
    do {
      (*this->_vptr_ASTVisitor[3])(this,*(undefined8 *)((long)&ppVar2->object + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  return;
}

Assistant:

virtual void visit (AST::Assignment& a)
    {
        visitObject (a.target);
        visitObject (a.newValue);
    }